

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O0

void __thiscall QHttp2Connection::handleCONTINUATION(QHttp2Connection *this)

{
  bool bVar1;
  quint32 qVar2;
  quint32 qVar3;
  vector<Http2::Frame,_std::allocator<Http2::Frame>_> *in_RDI;
  long in_FS_OFFSET;
  QHttp2Connection *unaff_retaddr;
  bool endHeaders;
  QHttp2Connection *in_stack_00000088;
  undefined7 in_stack_ffffffffffffffc8;
  FrameFlag in_stack_ffffffffffffffcf;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  long lVar4;
  Http2Error errorCode;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = std::vector<Http2::Frame,_std::allocator<Http2::Frame>_>::empty(in_RDI);
  errorCode = (Http2Error)((ulong)lVar4 >> 0x20);
  if (bVar1) {
    connectionError(unaff_retaddr,errorCode,
                    (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  }
  else if (((ulong)in_RDI[0x19].super__Vector_base<Http2::Frame,_std::allocator<Http2::Frame>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage & 1) == 0) {
    connectionError(unaff_retaddr,errorCode,
                    (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  }
  else {
    qVar2 = Http2::Frame::streamID((Frame *)0x2b943c);
    std::vector<Http2::Frame,_std::allocator<Http2::Frame>_>::front
              ((vector<Http2::Frame,_std::allocator<Http2::Frame>_> *)
               CONCAT44(qVar2,in_stack_ffffffffffffffd0));
    qVar3 = Http2::Frame::streamID((Frame *)0x2b9459);
    if (qVar2 == qVar3) {
      Http2::Frame::flags((Frame *)CONCAT44(qVar2,in_stack_ffffffffffffffd0));
      bVar1 = QFlags<Http2::FrameFlag>::testFlag
                        ((QFlags<Http2::FrameFlag> *)CONCAT44(qVar2,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffcf);
      std::vector<Http2::Frame,_std::allocator<Http2::Frame>_>::push_back
                ((vector<Http2::Frame,_std::allocator<Http2::Frame>_> *)
                 CONCAT44(qVar2,in_stack_ffffffffffffffd0),
                 (value_type *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
      if (bVar1) {
        *(undefined1 *)
         &in_RDI[0x19].super__Vector_base<Http2::Frame,_std::allocator<Http2::Frame>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = 0;
        handleContinuedHEADERS(in_stack_00000088);
      }
    }
    else {
      connectionError(unaff_retaddr,(Http2Error)((ulong)lVar4 >> 0x20),
                      (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttp2Connection::handleCONTINUATION()
{
    Q_ASSERT(inboundFrame.type() == FrameType::CONTINUATION);
    if (continuedFrames.empty())
        return connectionError(PROTOCOL_ERROR,
                               "CONTINUATION without a preceding HEADERS or PUSH_PROMISE");
    if (!continuationExpected)
        return connectionError(PROTOCOL_ERROR,
                               "CONTINUATION after a frame with the END_HEADERS flag set");

    if (inboundFrame.streamID() != continuedFrames.front().streamID())
        return connectionError(PROTOCOL_ERROR, "CONTINUATION on invalid stream");

    const bool endHeaders = inboundFrame.flags().testFlag(FrameFlag::END_HEADERS);
    continuedFrames.push_back(std::move(inboundFrame));

    if (!endHeaders)
        return;

    continuationExpected = false;
    handleContinuedHEADERS();
}